

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

atomic<google::protobuf::internal::SerialArena_*> * __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::arena
          (SerialArenaChunk *this,uint32_t i)

{
  Nullable<const_char_*> failure_msg;
  CopyConst<const_char,_ElementType<2UL>_>_conflict *pCVar1;
  uint32_t local_2c;
  LayoutType<std::integer_sequence<unsigned_long,_1UL>,_sizeof___(Ts)___adl_barrier::Min(sizeof___(Ts),_integer_sequence<unsigned_long,_1UL>::size()),_google::protobuf::internal::SerialArenaChunkHeader,_std::atomic<void_*>,_std::atomic<google::protobuf::internal::SerialArena_*>_>
  local_28;
  
  local_28.size_[0]._0_4_ = i;
  local_2c = capacity(this);
  failure_msg = absl::lts_20250127::log_internal::Check_LTImpl<unsigned_int,unsigned_int>
                          ((uint *)&local_28,&local_2c,"i < capacity()");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_28.size_ = (size_t  [2])Layout(this);
    pCVar1 = absl::lts_20250127::container_internal::internal_layout::
             LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long,1ul>,std::integer_sequence<unsigned_long,0ul,1ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
             ::Pointer<2ul,char_const>
                       ((LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long,1ul>,std::integer_sequence<unsigned_long,0ul,1ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                         *)&local_28,(char *)this);
    return pCVar1 + i;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
             ,0x1d0,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

const std::atomic<SerialArena*>& arena(uint32_t i) const {
    ABSL_DCHECK_LT(i, capacity());
    return Layout().Pointer<kArenas>(ptr())[i];
  }